

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall wasm::DataFlow::Graph::makeConst(Graph *this,Literal *value)

{
  iterator iVar1;
  Const *expr;
  Node *pNVar2;
  mapped_type *ppNVar3;
  Builder local_50;
  Builder builder;
  
  iVar1 = std::
          _Hashtable<wasm::Literal,_std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literal>,_std::hash<wasm::Literal>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->constantNodes)._M_h,value);
  if (iVar1.super__Node_iterator_base<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_true>.
      _M_cur == (__node_type *)0x0) {
    local_50.wasm = this->module;
    Literal::Literal((Literal *)&builder,value);
    expr = Builder::makeConst(&local_50,(Literal *)&builder);
    Literal::~Literal((Literal *)&builder);
    pNVar2 = Node::makeExpr((Expression *)expr,(Expression *)expr);
    pNVar2 = addNode(this,pNVar2);
    ppNVar3 = std::__detail::
              _Map_base<wasm::Literal,_std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literal>,_std::hash<wasm::Literal>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Literal,_std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literal>,_std::hash<wasm::Literal>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->constantNodes,value);
    *ppNVar3 = pNVar2;
  }
  else {
    pNVar2 = *(Node **)((long)iVar1.
                              super__Node_iterator_base<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_true>
                              ._M_cur + 0x20);
  }
  return pNVar2;
}

Assistant:

Node* makeConst(Literal value) {
    auto iter = constantNodes.find(value);
    if (iter != constantNodes.end()) {
      return iter->second;
    }
    // Create one for this literal.
    Builder builder(*module);
    auto* c = builder.makeConst(value);
    auto* ret = addNode(Node::makeExpr(c, c));
    constantNodes[value] = ret;
    return ret;
  }